

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O2

opj_pi_iterator_t * opj_pi_create(opj_image_t *image,opj_cp_t *cp,OPJ_UINT32 tileno)

{
  opj_tcp_t *poVar1;
  opj_tccp_t *poVar2;
  uint uVar3;
  opj_pi_iterator_t *p_pi;
  opj_pi_comp_t *poVar4;
  void *pvVar5;
  uint uVar6;
  uint p_nb_elements;
  long lVar7;
  long lVar8;
  ulong uVar9;
  opj_pi_iterator_t *poVar10;
  
  if (cp->th * cp->tw <= tileno) {
    __assert_fail("tileno < cp->tw * cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x3ea,
                  "opj_pi_iterator_t *opj_pi_create(const opj_image_t *, const opj_cp_t *, OPJ_UINT32)"
                 );
  }
  poVar1 = cp->tcps;
  p_nb_elements = poVar1[tileno].numpocs + 1;
  p_pi = (opj_pi_iterator_t *)opj_calloc((ulong)p_nb_elements,0xf8);
  uVar6 = 0;
  poVar10 = p_pi;
  if (p_pi == (opj_pi_iterator_t *)0x0) {
LAB_001204ef:
    p_pi = (opj_pi_iterator_t *)0x0;
  }
  else {
    for (; uVar6 != p_nb_elements; uVar6 = uVar6 + 1) {
      poVar4 = (opj_pi_comp_t *)opj_calloc((ulong)image->numcomps,0x18);
      poVar10->comps = poVar4;
      if (poVar4 == (opj_pi_comp_t *)0x0) {
LAB_001204e0:
        opj_pi_destroy(p_pi,p_nb_elements);
        goto LAB_001204ef;
      }
      uVar3 = image->numcomps;
      poVar10->numcomps = uVar3;
      lVar7 = 4;
      lVar8 = 0x10;
      for (uVar9 = 0; uVar9 < uVar3; uVar9 = uVar9 + 1) {
        poVar4 = poVar10->comps;
        poVar2 = poVar1[tileno].tccps;
        pvVar5 = opj_calloc((ulong)*(uint *)((long)poVar2->stepsizes + lVar7 + -0x1c),0x10);
        *(void **)((long)&poVar4->dx + lVar8) = pvVar5;
        if (pvVar5 == (void *)0x0) goto LAB_001204e0;
        *(undefined4 *)((long)poVar4 + lVar8 + -8) =
             *(undefined4 *)((long)poVar2->stepsizes + lVar7 + -0x1c);
        uVar3 = image->numcomps;
        lVar8 = lVar8 + 0x18;
        lVar7 = lVar7 + 0x438;
      }
      poVar10 = poVar10 + 1;
    }
  }
  return p_pi;
}

Assistant:

static opj_pi_iterator_t * opj_pi_create(const opj_image_t *image,
        const opj_cp_t *cp,
        OPJ_UINT32 tileno)
{
    /* loop*/
    OPJ_UINT32 pino, compno;
    /* number of poc in the p_pi*/
    OPJ_UINT32 l_poc_bound;

    /* pointers to tile coding parameters and components.*/
    opj_pi_iterator_t *l_pi = 00;
    opj_tcp_t *tcp = 00;
    const opj_tccp_t *tccp = 00;

    /* current packet iterator being allocated*/
    opj_pi_iterator_t *l_current_pi = 00;

    /* preconditions in debug*/
    assert(cp != 00);
    assert(image != 00);
    assert(tileno < cp->tw * cp->th);

    /* initializations*/
    tcp = &cp->tcps[tileno];
    l_poc_bound = tcp->numpocs + 1;

    /* memory allocations*/
    l_pi = (opj_pi_iterator_t*) opj_calloc((l_poc_bound),
                                           sizeof(opj_pi_iterator_t));
    if (!l_pi) {
        return NULL;
    }

    l_current_pi = l_pi;
    for (pino = 0; pino < l_poc_bound ; ++pino) {

        l_current_pi->comps = (opj_pi_comp_t*) opj_calloc(image->numcomps,
                              sizeof(opj_pi_comp_t));
        if (! l_current_pi->comps) {
            opj_pi_destroy(l_pi, l_poc_bound);
            return NULL;
        }

        l_current_pi->numcomps = image->numcomps;

        for (compno = 0; compno < image->numcomps; ++compno) {
            opj_pi_comp_t *comp = &l_current_pi->comps[compno];

            tccp = &tcp->tccps[compno];

            comp->resolutions = (opj_pi_resolution_t*) opj_calloc(tccp->numresolutions,
                                sizeof(opj_pi_resolution_t));
            if (!comp->resolutions) {
                opj_pi_destroy(l_pi, l_poc_bound);
                return 00;
            }

            comp->numresolutions = tccp->numresolutions;
        }
        ++l_current_pi;
    }
    return l_pi;
}